

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

ByteArray *
ot::commissioner::CommissionerImpl::GetCommissionerDatasetTlvs
          (ByteArray *__return_storage_ptr__,uint16_t aDatasetFlags)

{
  type local_2b;
  type local_2a;
  type local_29;
  type local_28;
  type local_27;
  type local_26;
  type local_25 [17];
  type local_14 [2];
  ushort local_12;
  ByteArray *pBStack_10;
  uint16_t aDatasetFlags_local;
  ByteArray *tlvTypes;
  
  local_14[1] = 0;
  local_12 = aDatasetFlags;
  pBStack_10 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  if ((local_12 & 0x4000) != 0) {
    local_14[0] = utils::to_underlying<ot::commissioner::tlv::Type>(kCommissionerSessionId);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,local_14);
  }
  if ((local_12 & 0x8000) != 0) {
    local_25[0] = utils::to_underlying<ot::commissioner::tlv::Type>(kBorderAgentLocator);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,local_25);
  }
  if ((local_12 & 0x2000) != 0) {
    local_26 = utils::to_underlying<ot::commissioner::tlv::Type>(kNetworkDiagIpv6Address);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_26);
  }
  if ((local_12 & 0x1000) != 0) {
    local_27 = utils::to_underlying<ot::commissioner::tlv::Type>(kAeSteeringData);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_27);
  }
  if ((local_12 & 0x800) != 0) {
    local_28 = utils::to_underlying<ot::commissioner::tlv::Type>(kNmkpSteeringData);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_28);
  }
  if ((local_12 & 0x400) != 0) {
    local_29 = utils::to_underlying<ot::commissioner::tlv::Type>(kJoinerUdpPort);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_29);
  }
  if ((local_12 & 0x200) != 0) {
    local_2a = utils::to_underlying<ot::commissioner::tlv::Type>(kAeUdpPort);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_2a);
  }
  if ((local_12 & 0x100) != 0) {
    local_2b = utils::to_underlying<ot::commissioner::tlv::Type>(kNmkpUdpPort);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_2b);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray CommissionerImpl::GetCommissionerDatasetTlvs(uint16_t aDatasetFlags)
{
    ByteArray tlvTypes;

    if (aDatasetFlags & CommissionerDataset::kSessionIdBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kCommissionerSessionId));
    }

    if (aDatasetFlags & CommissionerDataset::kBorderAgentLocatorBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kBorderAgentLocator));
    }

    if (aDatasetFlags & CommissionerDataset::kSteeringDataBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kSteeringData));
    }

    if (aDatasetFlags & CommissionerDataset::kAeSteeringDataBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kAeSteeringData));
    }

    if (aDatasetFlags & CommissionerDataset::kNmkpSteeringDataBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kNmkpSteeringData));
    }

    if (aDatasetFlags & CommissionerDataset::kJoinerUdpPortBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kJoinerUdpPort));
    }

    if (aDatasetFlags & CommissionerDataset::kAeUdpPortBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kAeUdpPort));
    }

    if (aDatasetFlags & CommissionerDataset::kNmkpUdpPortBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kNmkpUdpPort));
    }
    return tlvTypes;
}